

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::
Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>::
do_call(Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
        *this,Function_Params *params,Type_Conversions_State *t_conversions)

{
  Boxed_Value *pBVar1;
  Function_Params t_params;
  guard_error *this_00;
  Type_Conversions_State *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Boxed_Value BVar3;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_68;
  Function_Params local_50;
  type_conflict12 *local_40;
  type *needs_conversions;
  type *is_a_match;
  Type_Conversions_State *local_28;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
  *this_local;
  
  local_28 = in_RCX;
  t_conversions_local = t_conversions;
  params_local = params;
  this_local = this;
  is_a_match._6_2_ =
       Dynamic_Proxy_Function::call_match_internal
                 ((Dynamic_Proxy_Function *)params,(Function_Params *)t_conversions,in_RCX);
  needs_conversions = std::get<0ul,bool,bool>((pair<bool,_bool> *)((long)&is_a_match + 6));
  local_40 = std::get<1ul,bool,bool>((pair<bool,_bool> *)((long)&is_a_match + 6));
  if ((*needs_conversions & 1U) != 0) {
    if ((*local_40 & 1U) == 0) {
      (*(code *)params[6].m_end)(this,t_conversions_local);
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      pBVar1 = params[6].m_end;
      t_params.m_begin = *(Boxed_Value **)&t_conversions_local->m_conversions;
      t_params.m_end = *(Boxed_Value **)&t_conversions_local->m_saves;
      Param_Types::convert(&local_68,(Param_Types *)&params[2].m_end,t_params,local_28);
      Function_Params::Function_Params(&local_50,&local_68);
      (*(code *)pBVar1)(this,&local_50);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
                (&local_68);
      _Var2._M_pi = extraout_RDX;
    }
    BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar3.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (guard_error *)__cxa_allocate_exception(0x10);
  exception::guard_error::guard_error(this_00);
  __cxa_throw(this_00,&exception::guard_error::typeinfo,exception::guard_error::~guard_error);
}

Assistant:

Boxed_Value do_call(const Function_Params &params, const Type_Conversions_State &t_conversions) const override {
        const auto [is_a_match, needs_conversions] = call_match_internal(params, t_conversions);
        if (is_a_match) {
          if (needs_conversions) {
            return m_f(Function_Params{m_param_types.convert(params, t_conversions)});
          } else {
            return m_f(params);
          }
        } else {
          throw exception::guard_error();
        }
      }